

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListOverlay.cpp
# Opt level: O2

void __thiscall
cursespp::ListOverlay::CustomListWindow::CustomListWindow
          (CustomListWindow *this,Callback *decorator,Callback *adapterChanged)

{
  ListWindow::ListWindow(&this->super_ListWindow,(IWindow *)0x0);
  (this->super_ListWindow).super_ScrollableWindow.super_Window.super_IWindow.super_IOrderable.
  _vptr_IOrderable = (_func_int **)&PTR__CustomListWindow_001c0520;
  (this->super_ListWindow).super_ScrollableWindow.super_Window.super_IWindow.super_IDisplayable.
  _vptr_IDisplayable = (_func_int **)&PTR__CustomListWindow_001c0790;
  (this->super_ListWindow).super_ScrollableWindow.super_Window.super_IWindow.super_IMouseHandler.
  _vptr_IMouseHandler = (_func_int **)&PTR__CustomListWindow_001c07c0;
  (this->super_ListWindow).super_ScrollableWindow.super_Window.super_IWindow.super_IMessageTarget.
  _vptr_IMessageTarget = (_func_int **)&PTR__CustomListWindow_001c07e8;
  (this->super_ListWindow).super_ScrollableWindow.super_IScrollable._vptr_IScrollable =
       (_func_int **)&PTR__CustomListWindow_001c0810;
  (this->super_ListWindow).super_ScrollableWindow.super_IKeyHandler._vptr_IKeyHandler =
       (_func_int **)&PTR__CustomListWindow_001c0860;
  *(undefined8 *)&(this->decorator).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->decorator).super__Function_base._M_functor + 8) = 0;
  (this->decorator).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->decorator)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->adapterChanged).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->adapterChanged).super__Function_base._M_functor + 8) = 0;
  (this->adapterChanged).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->adapterChanged)._M_invoker = (_Invoker_type)0x0;
  std::function<void_()>::operator=(&this->decorator,decorator);
  std::function<void_()>::operator=(&this->adapterChanged,adapterChanged);
  return;
}

Assistant:

CustomListWindow(Callback decorator, Callback adapterChanged)
        : ListWindow() {
            this->decorator = decorator;
            this->adapterChanged = adapterChanged;
        }